

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O3

Vec_Int_t * Ssc_ManFindPivotSat(Ssc_Man_t *p)

{
  int iVar1;
  Vec_Int_t *vPattern;
  int *piVar2;
  int iVar3;
  
  iVar1 = sat_solver_solve(p->pSat,(lit *)0x0,(lit *)0x0,(long)p->pPars->nBTLimit,0,0,0);
  if (iVar1 == -1) {
    vPattern = (Vec_Int_t *)0x1;
  }
  else if (iVar1 == 1) {
    iVar1 = p->pFraig->vCis->nSize;
    vPattern = (Vec_Int_t *)malloc(0x10);
    iVar3 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar3 = iVar1;
    }
    vPattern->nSize = 0;
    vPattern->nCap = iVar3;
    if (iVar3 == 0) {
      piVar2 = (int *)0x0;
    }
    else {
      piVar2 = (int *)malloc((long)iVar3 << 2);
    }
    vPattern->pArray = piVar2;
    Ssc_ManCollectSatPattern(p,vPattern);
  }
  else {
    if (iVar1 != 0) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscSat.c"
                    ,0x14b,"Vec_Int_t *Ssc_ManFindPivotSat(Ssc_Man_t *)");
    }
    vPattern = (Vec_Int_t *)0x0;
  }
  return vPattern;
}

Assistant:

Vec_Int_t * Ssc_ManFindPivotSat( Ssc_Man_t * p )
{
    Vec_Int_t * vInit;
    int status = sat_solver_solve( p->pSat, NULL, NULL, p->pPars->nBTLimit, 0, 0, 0 );
    if ( status == l_False )
        return (Vec_Int_t *)(ABC_PTRINT_T)1;
    if ( status == l_Undef )
        return NULL;
    assert( status == l_True );
    vInit = Vec_IntAlloc( Gia_ManCiNum(p->pFraig) );
    Ssc_ManCollectSatPattern( p, vInit );
    return vInit;
}